

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

void __thiscall
database::Container::_SelectAll
          (Container *this,
          function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
          *lambda)

{
  anon_class_16_2_51289818 __f;
  const_iterator __first;
  const_iterator __last;
  undefined1 local_48 [8];
  impl_dataset_type result;
  function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
  *lambda_local;
  Container *this_local;
  
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)lambda;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
         *)local_48);
  __first = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
            ::begin(&this->m_schema);
  __last = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
           ::end(&this->m_schema);
  __f.result = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                *)local_48;
  __f.this = this;
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,database::DataType>>,database::Container::_SelectAll(std::function<void(std::map<std::__cxx11::string,std::vector<database::ComparableString,std::allocator<database::ComparableString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<database::ComparableString,std::allocator<database::ComparableString>>>>>const&)>const&)const::__0>
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>
              )__first._M_node,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>
              )__last._M_node,__f);
  std::
  function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
  ::operator()((function<void_(const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>_&)>
                *)result._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
                *)local_48);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<database::ComparableString,_std::allocator<database::ComparableString>_>_>_>_>
          *)local_48);
  return;
}

Assistant:

void database::Container::_SelectAll(const std::function<void(const database::impl_dataset_type&)>& lambda) const
{
  database::impl_dataset_type result;
  std::for_each(m_schema.begin(),m_schema.end(),[&](auto pair){
    size_t index = std::distance(m_schema.begin(),m_schema.find(pair.first));
    result[pair.first] = m_data -> operator[](index);
  });
  lambda(result);
}